

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

bool duckdb::ParquetWriteRotateNextFile
               (GlobalFunctionData *gstate,FunctionData *bind_data_p,optional_idx *file_size_bytes)

{
  ulong uVar1;
  pointer pPVar2;
  idx_t iVar3;
  
  if (file_size_bytes->index != 0xffffffffffffffff) {
    pPVar2 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::
             operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                         *)(gstate + 1));
    uVar1 = (pPVar2->total_written).super___atomic_base<unsigned_long>._M_i;
    iVar3 = optional_idx::GetIndex(file_size_bytes);
    if (iVar3 < uVar1) {
      return true;
    }
  }
  if (bind_data_p[0x16]._vptr_FunctionData != (_func_int **)0xffffffffffffffff) {
    pPVar2 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::
             operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                         *)(gstate + 1));
    uVar1 = (pPVar2->num_row_groups).super___atomic_base<unsigned_long>._M_i;
    iVar3 = optional_idx::GetIndex((optional_idx *)(bind_data_p + 0x16));
    if (iVar3 <= uVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ParquetWriteRotateNextFile(GlobalFunctionData &gstate, FunctionData &bind_data_p,
                                const optional_idx &file_size_bytes) {
	auto &global_state = gstate.Cast<ParquetWriteGlobalState>();
	auto &bind_data = bind_data_p.Cast<ParquetWriteBindData>();
	if (file_size_bytes.IsValid() && global_state.writer->FileSize() > file_size_bytes.GetIndex()) {
		return true;
	}
	if (bind_data.row_groups_per_file.IsValid() &&
	    global_state.writer->NumberOfRowGroups() >= bind_data.row_groups_per_file.GetIndex()) {
		return true;
	}
	return false;
}